

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ngx_file.c
# Opt level: O2

ngx_int_t ngx_create_paths(ngx_cycle_t *cycle,ngx_uid_t user)

{
  void *pvVar1;
  int iVar2;
  int *piVar3;
  char *fmt;
  undefined8 uVar4;
  ulong uVar5;
  ngx_log_t *pnVar6;
  stat64 local_c0;
  
  pvVar1 = (cycle->paths).elts;
  uVar5 = 0;
  do {
    if ((cycle->paths).nelts <= uVar5) {
      return 0;
    }
    iVar2 = mkdir(*(char **)(*(long *)((long)pvVar1 + uVar5 * 8) + 8),0x1c0);
    if (iVar2 == -1) {
      piVar3 = __errno_location();
      if (*piVar3 != 0x11) {
        if (cycle->log->log_level != 0) {
          ngx_log_error_core(1,cycle->log,*piVar3,"mkdir() \"%s\" failed",
                             *(undefined8 *)(*(long *)((long)pvVar1 + uVar5 * 8) + 8));
          return -1;
        }
        return -1;
      }
    }
    if (user != 0xffffffff) {
      iVar2 = stat64(*(char **)(*(long *)((long)pvVar1 + uVar5 * 8) + 8),&local_c0);
      if (iVar2 == -1) {
        pnVar6 = cycle->log;
        if (pnVar6->log_level == 0) {
          return -1;
        }
        piVar3 = __errno_location();
        iVar2 = *piVar3;
        uVar4 = *(undefined8 *)(*(long *)((long)pvVar1 + uVar5 * 8) + 8);
        fmt = "stat() \"%s\" failed";
LAB_0011a3d4:
        ngx_log_error_core(1,pnVar6,iVar2,fmt,uVar4);
        return -1;
      }
      if ((local_c0.st_uid != user) &&
         (iVar2 = chown(*(char **)(*(long *)((long)pvVar1 + uVar5 * 8) + 8),user,0xffffffff),
         iVar2 == -1)) {
        pnVar6 = cycle->log;
        if (pnVar6->log_level == 0) {
          return -1;
        }
        piVar3 = __errno_location();
        ngx_log_error_core(1,pnVar6,*piVar3,"chown(\"%s\", %d) failed",
                           *(undefined8 *)(*(long *)((long)pvVar1 + uVar5 * 8) + 8),(ulong)user);
        return -1;
      }
      if (((~local_c0.st_mode & 0x1c0) != 0) &&
         (iVar2 = chmod(*(char **)(*(long *)((long)pvVar1 + uVar5 * 8) + 8),local_c0.st_mode | 0x1c0
                       ), iVar2 == -1)) {
        pnVar6 = cycle->log;
        if (pnVar6->log_level == 0) {
          return -1;
        }
        piVar3 = __errno_location();
        iVar2 = *piVar3;
        uVar4 = *(undefined8 *)(*(long *)((long)pvVar1 + uVar5 * 8) + 8);
        fmt = "chmod() \"%s\" failed";
        goto LAB_0011a3d4;
      }
    }
    uVar5 = uVar5 + 1;
  } while( true );
}

Assistant:

ngx_int_t
ngx_create_paths(ngx_cycle_t *cycle, ngx_uid_t user)
{
    ngx_err_t         err;
    ngx_uint_t        i;
    ngx_path_t      **path;

    path = cycle->paths.elts;
    for (i = 0; i < cycle->paths.nelts; i++) {

        if (ngx_create_dir(path[i]->name.data, 0700) == NGX_FILE_ERROR) {
            err = ngx_errno;
            if (err != NGX_EEXIST) {
                ngx_log_error(NGX_LOG_EMERG, cycle->log, err,
                              ngx_create_dir_n " \"%s\" failed",
                              path[i]->name.data);
                return NGX_ERROR;
            }
        }

        if (user == (ngx_uid_t) NGX_CONF_UNSET_UINT) {
            continue;
        }

#if !(NGX_WIN32)
        {
        ngx_file_info_t   fi;

        if (ngx_file_info((const char *) path[i]->name.data, &fi)
            == NGX_FILE_ERROR)
        {
            ngx_log_error(NGX_LOG_EMERG, cycle->log, ngx_errno,
                          ngx_file_info_n " \"%s\" failed", path[i]->name.data);
            return NGX_ERROR;
        }

        if (fi.st_uid != user) {
            if (chown((const char *) path[i]->name.data, user, -1) == -1) {
                ngx_log_error(NGX_LOG_EMERG, cycle->log, ngx_errno,
                              "chown(\"%s\", %d) failed",
                              path[i]->name.data, user);
                return NGX_ERROR;
            }
        }

        if ((fi.st_mode & (S_IRUSR|S_IWUSR|S_IXUSR))
                                                  != (S_IRUSR|S_IWUSR|S_IXUSR))
        {
            fi.st_mode |= (S_IRUSR|S_IWUSR|S_IXUSR);

            if (chmod((const char *) path[i]->name.data, fi.st_mode) == -1) {
                ngx_log_error(NGX_LOG_EMERG, cycle->log, ngx_errno,
                              "chmod() \"%s\" failed", path[i]->name.data);
                return NGX_ERROR;
            }
        }
        }
#endif
    }

    return NGX_OK;
}